

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

void __thiscall FConfigFile::ClearCurrentSection(FConfigFile *this)

{
  FConfigEntry *pFVar1;
  FConfigSection *pFVar2;
  FConfigEntry *pFVar3;
  
  if (this->CurrentSection != (FConfigSection *)0x0) {
    pFVar3 = this->CurrentSection->RootEntry;
    while (pFVar3 != (FConfigEntry *)0x0) {
      pFVar1 = pFVar3->Next;
      if (pFVar3->Value != (char *)0x0) {
        operator_delete__(pFVar3->Value);
      }
      operator_delete__(pFVar3);
      pFVar3 = pFVar1;
    }
    pFVar2 = this->CurrentSection;
    pFVar2->RootEntry = (FConfigEntry *)0x0;
    pFVar2->LastEntryPtr = &pFVar2->RootEntry;
  }
  return;
}

Assistant:

void FConfigFile::ClearCurrentSection ()
{
	if (CurrentSection != NULL)
	{
		FConfigEntry *entry, *next;

		entry = CurrentSection->RootEntry;
		while (entry != NULL)
		{
			next = entry->Next;
			delete[] entry->Value;
			delete[] (char *)entry;
			entry = next;
		}
		CurrentSection->RootEntry = NULL;
		CurrentSection->LastEntryPtr = &CurrentSection->RootEntry;
	}
}